

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

void Fra_SmlInitialize(Fra_Sml_t *p,int fInit)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  int fInit_local;
  Fra_Sml_t *p_local;
  
  if (fInit == 0) {
    for (local_24 = 0; iVar1 = Vec_PtrSize(p->pAig->vCis), local_24 < iVar1; local_24 = local_24 + 1
        ) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_24);
      Fra_SmlAssignRandom(p,pAVar3);
    }
  }
  else {
    iVar1 = Aig_ManRegNum(p->pAig);
    if (iVar1 < 1) {
      __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x196,"void Fra_SmlInitialize(Fra_Sml_t *, int)");
    }
    iVar1 = Aig_ManRegNum(p->pAig);
    iVar2 = Aig_ManCiNum(p->pAig);
    if (iVar2 <= iVar1) {
      __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x197,"void Fra_SmlInitialize(Fra_Sml_t *, int)");
    }
    local_24 = 0;
    while( true ) {
      iVar1 = Aig_ManCiNum(p->pAig);
      iVar2 = Aig_ManRegNum(p->pAig);
      if (iVar1 - iVar2 <= local_24) break;
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_24);
      Fra_SmlAssignRandom(p,pAVar3);
      local_24 = local_24 + 1;
    }
    local_24 = Aig_ManCiNum(p->pAig);
    iVar1 = Aig_ManRegNum(p->pAig);
    for (local_24 = local_24 - iVar1; iVar1 = Vec_PtrSize(p->pAig->vCis), local_24 < iVar1;
        local_24 = local_24 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_24);
      Fra_SmlAssignConst(p,pAVar3,0,0);
    }
  }
  return;
}

Assistant:

void Fra_SmlInitialize( Fra_Sml_t * p, int fInit )
{
    Aig_Obj_t * pObj;
    int i;
    if ( fInit )
    {
        assert( Aig_ManRegNum(p->pAig) > 0 );
        assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
        // assign random info for primary inputs
        Aig_ManForEachPiSeq( p->pAig, pObj, i )
            Fra_SmlAssignRandom( p, pObj );
        // assign the initial state for the latches
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_SmlAssignConst( p, pObj, 0, 0 );
    }
    else
    {
        Aig_ManForEachCi( p->pAig, pObj, i )
            Fra_SmlAssignRandom( p, pObj );
    }
}